

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O0

bool benchmark::anon_unknown_1::ReadIntFromFile(char *file,long *value)

{
  ssize_t sVar1;
  long lVar2;
  long *in_RSI;
  char *in_RDI;
  long temp_value;
  char *err;
  char line [1024];
  int fd;
  bool ret;
  CheckHandler *this;
  char *in_stack_fffffffffffffbb8;
  char *in_stack_fffffffffffffbc0;
  char *in_stack_fffffffffffffbc8;
  uint7 in_stack_fffffffffffffbd0;
  byte bVar3;
  CheckHandler local_428;
  char *local_420;
  char local_418 [1024];
  int local_18;
  byte local_11;
  long *local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  local_18 = open(in_RDI,0);
  if (local_18 != -1) {
    memset(local_418,0,0x400);
    sVar1 = read(local_18,local_418,0x3ff);
    bVar3 = 0;
    if (sVar1 == 0) {
      this = &local_428;
      internal::CheckHandler::CheckHandler
                ((CheckHandler *)(ulong)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                 in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,(int)((ulong)this >> 0x20));
      bVar3 = 1;
      internal::CheckHandler::GetLog(this);
    }
    else {
      internal::GetNullLogInstance();
    }
    if ((bVar3 & 1) != 0) {
      internal::CheckHandler::~CheckHandler((CheckHandler *)&LAB_0017e56e);
    }
    lVar2 = strtol(local_418,&local_420,10);
    if ((local_418[0] != '\0') && ((*local_420 == '\n' || (*local_420 == '\0')))) {
      *local_10 = lVar2;
      local_11 = 1;
    }
    close(local_18);
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool ReadIntFromFile(const char* file, long* value) {
  bool ret = false;
  int fd = open(file, O_RDONLY);
  if (fd != -1) {
    char line[1024];
    char* err;
    memset(line, '\0', sizeof(line));
    CHECK(read(fd, line, sizeof(line) - 1));
    const long temp_value = strtol(line, &err, 10);
    if (line[0] != '\0' && (*err == '\n' || *err == '\0')) {
      *value = temp_value;
      ret = true;
    }
    close(fd);
  }
  return ret;
}